

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::WriteAmpEnable(AmpIO *this,uint32_t mask,uint32_t state)

{
  uint uVar1;
  BasePort *pBVar2;
  uint uVar3;
  uint uVar4;
  undefined1 uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  quadlet_t localBuffer [18];
  uint auStack_68 [18];
  
  if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar6 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar6 == 0x514c4131) {
      pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
      iVar7 = (*pBVar2->_vptr_BasePort[0x24])
                        (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0,
                         (ulong)(mask << 8 | state));
      return SUB41(iVar7,0);
    }
    uVar10 = (uint)(this->super_FpgaIO).super_BoardIO.BoardId;
    uVar8 = this->NumMotors;
    auStack_68[this->WB_HEADER_OFFSET] = (uVar10 & 0xf) << 0x10 | (uVar8 + 2) * 0x1000000;
    uVar1 = this->WB_CURR_OFFSET;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      uVar3 = (uint)uVar9;
      uVar4 = (uint)((state >> (uVar3 & 0x1f) & 1) != 0) << 4 | 0x20;
      if ((mask >> (uVar3 & 0x1f) & 1) == 0) {
        uVar4 = 0;
      }
      auStack_68[uVar1 + uVar3] = uVar4;
    }
    auStack_68[this->WB_CTRL_OFFSET] = 0;
    pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
    uVar8 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])(this);
    iVar7 = (*pBVar2->_vptr_BasePort[0x27])(pBVar2,(ulong)uVar10,0,auStack_68,(ulong)uVar8);
    uVar5 = (undefined1)iVar7;
  }
  return (bool)uVar5;
}

Assistant:

bool AmpIO::WriteAmpEnable(uint32_t mask, uint32_t state)
{
    if (!port)
        return false;

    bool ret;
    if (GetHardwareVersion() == QLA1_String) {
        // Following still works for Firmware Rev 8 (at least for QLA)
        quadlet_t write_data = (mask << 8) | state;
        ret = port->WriteQuadlet(BoardId, BoardIO::BOARD_STATUS, write_data);
    }
    else {
        // For other boards, it is necessary to do a block write
        quadlet_t localBuffer[MAX_CHANNELS+2];
        localBuffer[WB_HEADER_OFFSET] = bswap_32((BoardId & 0x0F) << 8 | ((NumMotors+2) & 0xFF));
        for (uint32_t i = 0; i < NumMotors; i++) {
            uint32_t iMask = (1 << i);
            localBuffer[WB_CURR_OFFSET+i] = 0;
            if (mask & iMask) {
                localBuffer[WB_CURR_OFFSET+i] |= bswap_32(MOTOR_ENABLE_MASK);
                if (state & iMask) {
                    localBuffer[WB_CURR_OFFSET+i] |=  bswap_32(MOTOR_ENABLE_BIT);
                }
            }
        }
        localBuffer[WB_CTRL_OFFSET] = 0;
        ret = port->WriteBlock(BoardId, 0, localBuffer, GetWriteNumBytes());
    }
    return ret;
}